

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

int mpt::type_properties<mpt::span<int_*const>_>::id(bool obtain)

{
  int iVar1;
  type_traits *ptVar2;
  uint uVar3;
  
  if (0 < id::_valtype) {
    return id::_valtype;
  }
  iVar1 = type_properties<int_*>::id::_valtype;
  if (type_properties<int_*>::id::_valtype < 1) {
    iVar1 = -3;
  }
  uVar3 = iVar1 + 0xe0U & 0xff;
  if (iVar1 - 0x7bU < 0xffffffe5 || uVar3 == 0) {
    if (!obtain) {
      return -3;
    }
    ptVar2 = _dynamic_traits();
    uVar3 = mpt::type_traits::add(ptVar2);
  }
  id::_valtype = uVar3;
  return uVar3;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		/* use vector IDs for builtin types */
		int type = type_properties<T>::id(false);
		if ((type = MPT_type_toVector(type)) > 0) {
			return _valtype = type;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*_dynamic_traits());
	}